

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pusher.cpp
# Opt level: O0

void __thiscall DPusher::ChangeValues(DPusher *this,int magnitude,int angle)

{
  TVector2<double> local_30;
  TAngle<double> local_20;
  DAngle ang;
  int angle_local;
  int magnitude_local;
  DPusher *this_local;
  
  ang.Degrees._0_4_ = angle;
  ang.Degrees._4_4_ = magnitude;
  TAngle<double>::TAngle(&local_20,(double)angle * 1.40625);
  TAngle<double>::ToVector((TAngle<double> *)&local_30,(double)ang.Degrees._4_4_);
  TVector2<double>::operator=(&this->m_PushVec,&local_30);
  this->m_Magnitude = (double)ang.Degrees._4_4_;
  return;
}

Assistant:

void ChangeValues (int magnitude, int angle)
	{
		DAngle ang = angle * (360. / 256.);
		m_PushVec = ang.ToVector(magnitude);
		m_Magnitude = magnitude;
	}